

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeRename(sqlite3_vtab *pVtab,char *zNewName)

{
  char **pzErrMsg;
  char *in_RSI;
  sqlite3 *in_RDI;
  char *zSql;
  int rc;
  Rtree *pRtree;
  Rtree *pRtree_00;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  sqlite3 *db;
  
  iVar1 = 7;
  pRtree_00 = (Rtree *)in_RDI->flags;
  db = in_RDI;
  pzErrMsg = (char **)sqlite3_mprintf("ALTER TABLE %Q.\'%q_node\'   RENAME TO \"%w_node\";ALTER TABLE %Q.\'%q_parent\' RENAME TO \"%w_parent\";ALTER TABLE %Q.\'%q_rowid\'  RENAME TO \"%w_rowid\";"
                                      ,in_RDI->flags,in_RDI->lastRowid,in_RSI,in_RDI->flags,
                                      in_RDI->lastRowid);
  if (pzErrMsg != (char **)0x0) {
    nodeBlobReset(pRtree_00);
    iVar1 = sqlite3_exec(db,in_RSI,(sqlite3_callback)in_RDI,
                         (void *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),pzErrMsg);
    sqlite3_free((void *)0x298abe);
  }
  return iVar1;
}

Assistant:

static int rtreeRename(sqlite3_vtab *pVtab, const char *zNewName){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_NOMEM;
  char *zSql = sqlite3_mprintf(
    "ALTER TABLE %Q.'%q_node'   RENAME TO \"%w_node\";"
    "ALTER TABLE %Q.'%q_parent' RENAME TO \"%w_parent\";"
    "ALTER TABLE %Q.'%q_rowid'  RENAME TO \"%w_rowid\";"
    , pRtree->zDb, pRtree->zName, zNewName
    , pRtree->zDb, pRtree->zName, zNewName
    , pRtree->zDb, pRtree->zName, zNewName
  );
  if( zSql ){
    nodeBlobReset(pRtree);
    rc = sqlite3_exec(pRtree->db, zSql, 0, 0, 0);
    sqlite3_free(zSql);
  }
  return rc;
}